

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O3

IdentPtr __thiscall
HashTbl::FindExistingPid<char16_t>
          (HashTbl *this,char16_t *prgch,char16_t *end,int32 cch,uint32 luHash,IdentPtr **pppInsert,
          int32 *pBucketCount,int *depth)

{
  int iVar1;
  IdentPtr pIVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  IdentPtr pIVar6;
  
  uVar5 = this->m_luMask & luHash;
  pIVar2 = this->m_prgpidName[uVar5];
  if (pIVar2 == (IdentPtr)0x0) {
    pIVar6 = (IdentPtr)(this->m_prgpidName + uVar5);
    iVar4 = 0;
  }
  else {
    iVar1 = *depth;
    iVar4 = 0;
    do {
      pIVar6 = pIVar2;
      if (((pIVar6->m_luHash == luHash) && (pIVar6->m_cch == cch)) &&
         (iVar3 = bcmp(&pIVar6->field_0x22,prgch,(long)end - (long)prgch), iVar3 == 0)) {
        return pIVar6;
      }
      *depth = iVar1 + 1 + iVar4;
      iVar4 = iVar4 + 1;
      pIVar2 = pIVar6->m_pidNext;
    } while (pIVar6->m_pidNext != (Ident *)0x0);
  }
  if (pBucketCount != (int32 *)0x0) {
    *pBucketCount = iVar4;
  }
  if (pppInsert != (IdentPtr **)0x0) {
    *pppInsert = &pIVar6->m_pidNext;
  }
  return (IdentPtr)0x0;
}

Assistant:

IdentPtr HashTbl::FindExistingPid(
    CharType const * prgch,
    CharType const * end,
    int32 cch,
    uint32 luHash,
    IdentPtr **pppInsert,
    int32 *pBucketCount
#if PROFILE_DICTIONARY
    , int& depth
#endif
    )
{
    int32 bucketCount;
    IdentPtr pid;

    /* Search the hash table for an existing match */
    IdentPtr *ppid = &m_prgpidName[luHash & m_luMask];
    for (bucketCount = 0; nullptr != (pid = *ppid); ppid = &pid->m_pidNext, bucketCount++)
    {
        if (pid->m_luHash == luHash && (int)pid->m_cch == cch &&
            HashTbl::CharsAreEqual(pid->m_sz, prgch, end))
        {
            return pid;
        }
#if PROFILE_DICTIONARY
        ++depth;
#endif
    }

    if (pBucketCount)
    {
        *pBucketCount = bucketCount;
    }
    if (pppInsert)
    {
        *pppInsert = ppid;
    }

    return nullptr;
}